

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O3

value * mjs::json_stringify(value *__return_storage_ptr__,gc_heap_ptr<mjs::global_object> *global,
                           vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  pointer pvVar1;
  pointer pvVar2;
  bool bVar3;
  uint32_t uVar4;
  int iVar5;
  long *plVar6;
  long *plVar7;
  undefined8 *puVar8;
  int *piVar9;
  void *pvVar10;
  wchar_t wVar11;
  uint32_t index;
  uint uVar12;
  wchar_t wVar13;
  object_ptr *in_R9;
  anon_union_32_5_7b1e0779_for_value_3 *this;
  double dVar14;
  wstring_view key;
  string class_name;
  value item;
  object_ptr io;
  anon_class_16_2_fd512dd5 insert_item;
  object_ptr wrapper;
  stringify_state s;
  undefined1 local_148 [16];
  undefined1 local_138 [40];
  undefined1 local_110 [8];
  undefined1 local_108 [8];
  undefined1 local_100 [24];
  undefined1 local_e8 [16];
  gc_heap *local_d8;
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  undefined1 local_b0 [80];
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_60;
  _Alloc_hider local_50;
  pointer local_48;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_40;
  
  if ((args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    value::value(__return_storage_ptr__,(value *)&value::undefined);
  }
  else {
    gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    global_object::make_object((global_object *)local_c0);
    plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_c0);
    plVar7 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar7 + 0x98))(local_b0,plVar7,"");
    (**(code **)(*plVar6 + 8))
              (plVar6,local_b0,
               (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
               super__Vector_impl_data._M_start,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_b0);
    local_b0._0_8_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_b0._8_4_ = (global->super_gc_heap_ptr_untyped).pos_;
    if ((gc_heap *)local_b0._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_b0._0_8_,(gc_heap_ptr_untyped *)local_b0);
    }
    local_b0._64_8_ = &local_60;
    local_b0._16_8_ = (slot *)0x0;
    local_b0._24_4_ = 0;
    local_b0._32_8_ = (void *)0x0;
    local_b0._40_4_ = 0;
    local_b0._48_8_ = (gc_heap *)0x0;
    local_b0._56_4_ = 0;
    local_b0._72_8_ = 0;
    local_60._M_local_buf[0] = L'\0';
    local_50._M_p = (pointer)&local_40;
    local_48 = (pointer)0x0;
    local_40._M_local_buf[0] = L'\0';
    pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pvVar2 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pvVar1 == pvVar2) {
      __assert_fail("!args.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/json_object.cpp"
                    ,0x1c9,
                    "mjs::(anonymous namespace)::stringify_state::stringify_state(const gc_heap_ptr<global_object> &, const std::vector<value> &)"
                   );
    }
    if ((1 < (ulong)(((long)pvVar2 - (long)pvVar1 >> 3) * -0x3333333333333333)) &&
       (pvVar1[1].type_ == object)) {
      this = &pvVar1[1].field_1;
      bVar3 = gc_heap_ptr_untyped::has_type<mjs::function_object>((gc_heap_ptr_untyped *)&this->s_);
      if (bVar3) {
        gc_heap_ptr_untyped::operator=
                  ((gc_heap_ptr_untyped *)(local_b0 + 0x20),(gc_heap_ptr_untyped *)&this->s_);
      }
      else {
        bVar3 = is_array(&this->o_);
        if (bVar3) {
          local_d8 = (gc_heap *)local_b0._0_8_;
          puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->s_);
          local_110 = (undefined1  [8])0x6;
          local_108 = (undefined1  [8])0x19c278;
          (**(code **)*puVar8)(local_138,puVar8);
          uVar4 = to_uint32((value *)local_138);
          value::destroy((value *)local_138);
          local_110._0_4_ = uVar4;
          gc_heap::
          allocate_and_construct<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::gc_string,true>>,mjs::gc_heap&,unsigned_int&>
                    ((gc_heap *)local_138,(size_t)local_d8,(gc_heap *)0x10,(uint *)local_d8);
          gc_heap_ptr_untyped::operator=
                    ((gc_heap_ptr_untyped *)(local_b0 + 0x30),(gc_heap_ptr_untyped *)local_138);
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_138);
          local_e8._8_8_ = local_d8;
          local_e8._0_8_ = (stringify_state *)local_b0;
          if (uVar4 != 0) {
            uVar12 = 0;
            do {
              puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->s_);
              index_string_abi_cxx11_((wstring *)local_110,(mjs *)(ulong)uVar12,index);
              local_148._0_8_ = local_108;
              local_148._8_8_ = local_110;
              (**(code **)*puVar8)(local_138,puVar8,local_148);
              if (local_110 != (undefined1  [8])local_100) {
                operator_delete((void *)local_110,CONCAT44(local_100._4_4_,local_100._0_4_) * 4 + 4)
                ;
              }
              if (local_138._0_4_ == number) {
                to_string((mjs *)local_110,local_d8,(double)local_138._8_8_);
                anon_unknown_46::stringify_state::stringify_state::anon_class_16_2_fd512dd5::
                operator()((anon_class_16_2_fd512dd5 *)local_e8,(string *)local_110);
LAB_00147d23:
                gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_110);
              }
              else {
                if (local_138._0_4_ == object) {
                  local_110 = (undefined1  [8])local_138._8_8_;
                  local_108._0_4_ = local_138._16_4_;
                  if ((gc_heap *)local_138._8_8_ != (gc_heap *)0x0) {
                    gc_heap::attach((gc_heap *)local_138._8_8_,(gc_heap_ptr_untyped *)local_110);
                  }
                  gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_110);
                  object::class_name((object *)local_148);
                  piVar9 = (int *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_148);
                  if ((*piVar9 == 6) && (iVar5 = wmemcmp(piVar9 + 1,L"String",6), iVar5 == 0)) {
LAB_00147cec:
                    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_148);
                    to_string((mjs *)local_148,local_d8,(value *)local_138);
                    anon_unknown_46::stringify_state::stringify_state::anon_class_16_2_fd512dd5::
                    operator()((anon_class_16_2_fd512dd5 *)local_e8,(string *)local_148);
                  }
                  else {
                    gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_110);
                    object::class_name((object *)local_d0);
                    piVar9 = (int *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_d0);
                    if ((*piVar9 == 6) && (iVar5 = wmemcmp(piVar9 + 1,L"Number",6), iVar5 == 0)) {
                      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
                      goto LAB_00147cec;
                    }
                    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
                  }
                  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_148);
                  goto LAB_00147d23;
                }
                if (local_138._0_4_ == string) {
                  anon_unknown_46::stringify_state::stringify_state::anon_class_16_2_fd512dd5::
                  operator()((anon_class_16_2_fd512dd5 *)local_e8,(string *)(local_138 + 8));
                }
              }
              value::destroy((value *)local_138);
              uVar12 = uVar12 + 1;
            } while (uVar4 != uVar12);
          }
        }
      }
    }
    pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (2 < (ulong)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
                   -0x3333333333333333)) {
      value::value((value *)local_138,pvVar1 + 2);
      if (local_138._0_4_ == object) {
        local_e8._0_8_ = local_138._8_8_;
        local_e8._8_4_ = local_138._16_4_;
        if ((gc_heap *)local_138._8_8_ != (gc_heap *)0x0) {
          gc_heap::attach((gc_heap *)local_138._8_8_,(gc_heap_ptr_untyped *)local_e8);
        }
        gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_e8);
        object::class_name((object *)local_148);
        piVar9 = (int *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_148);
        if ((*piVar9 == 6) && (iVar5 = wmemcmp(piVar9 + 1,L"Number",6), iVar5 == 0)) {
          local_108 = (undefined1  [8])to_number((value *)local_138);
          local_110._0_4_ = 3;
          value::operator=((value *)local_138,(value *)local_110);
          value::destroy((value *)local_110);
        }
        else {
          piVar9 = (int *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_148);
          if ((*piVar9 == 6) && (iVar5 = wmemcmp(piVar9 + 1,L"String",6), iVar5 == 0)) {
            to_string((mjs *)local_d0,(gc_heap *)local_b0._0_8_,(value *)local_138);
            local_110._0_4_ = 4;
            local_108 = (undefined1  [8])local_d0._0_8_;
            local_100._0_4_ = local_d0._8_4_;
            if ((gc_heap *)local_d0._0_8_ != (gc_heap *)0x0) {
              gc_heap::attach((gc_heap *)local_d0._0_8_,(gc_heap_ptr_untyped *)local_108);
            }
            value::operator=((value *)local_138,(value *)local_110);
            value::destroy((value *)local_110);
            gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d0);
          }
        }
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_148);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_e8);
      }
      if (local_138._0_4_ == string) {
        pvVar10 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_138 + 8));
        std::__cxx11::wstring::_M_replace((ulong)&local_50,0,(wchar_t *)local_48,(long)pvVar10 + 4);
      }
      else if (local_138._0_4_ == number) {
        dVar14 = to_integer((double)local_138._8_8_);
        wVar11 = L'\n';
        if ((int)dVar14 < L'\n') {
          wVar11 = (int)dVar14;
        }
        wVar13 = L'\0';
        if (L'\0' < wVar11) {
          wVar13 = wVar11;
        }
        local_110 = (undefined1  [8])local_100;
        std::__cxx11::wstring::_M_construct((ulong)local_110,wVar13);
        std::__cxx11::wstring::operator=((wstring *)&local_50,(wstring *)local_110);
        if (local_110 != (undefined1  [8])local_100) {
          operator_delete((void *)local_110,CONCAT44(local_100._4_4_,local_100._0_4_) * 4 + 4);
        }
      }
      value::destroy((value *)local_138);
    }
    key._M_str = (wchar_t *)local_c0;
    key._M_len = (size_t)L"";
    anon_unknown_46::json_str
              (__return_storage_ptr__,(anon_unknown_46 *)local_b0,(stringify_state *)0x0,key,in_R9);
    anon_unknown_46::stringify_state::~stringify_state((stringify_state *)local_b0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_c0);
  }
  return __return_storage_ptr__;
}

Assistant:

value json_stringify(const gc_heap_ptr<global_object>& global, const std::vector<value>& args) {
    if (args.empty()) {
        return value::undefined;
    }

    auto wrapper = global->make_object();
    wrapper->put(global->common_string(""), args.front());

    stringify_state s{global, args};

    return json_str(s, L"", wrapper);
}